

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlStreamCtxtAddState(xmlStreamCtxtPtr comp,int idx,int level)

{
  int iVar1;
  int *piVar2;
  int newSize;
  int *tmp;
  int i;
  int level_local;
  int idx_local;
  xmlStreamCtxtPtr comp_local;
  
  for (tmp._4_4_ = 0; tmp._4_4_ < comp->nbState; tmp._4_4_ = tmp._4_4_ + 1) {
    if (comp->states[tmp._4_4_ << 1] < 0) {
      comp->states[tmp._4_4_ << 1] = idx;
      comp->states[tmp._4_4_ * 2 + 1] = level;
      return tmp._4_4_;
    }
  }
  if (comp->maxState <= comp->nbState) {
    iVar1 = xmlGrowCapacity(comp->maxState,8,4,1000000000);
    if (iVar1 < 0) {
      return -1;
    }
    piVar2 = (int *)(*xmlRealloc)(comp->states,(long)iVar1 << 3);
    if (piVar2 == (int *)0x0) {
      return -1;
    }
    comp->states = piVar2;
    comp->maxState = iVar1;
  }
  comp->states[comp->nbState << 1] = idx;
  iVar1 = comp->nbState;
  comp->nbState = iVar1 + 1;
  comp->states[iVar1 * 2 + 1] = level;
  return comp->nbState + -1;
}

Assistant:

static int
xmlStreamCtxtAddState(xmlStreamCtxtPtr comp, int idx, int level) {
    int i;
    for (i = 0;i < comp->nbState;i++) {
        if (comp->states[2 * i] < 0) {
	    comp->states[2 * i] = idx;
	    comp->states[2 * i + 1] = level;
	    return(i);
	}
    }
    if (comp->nbState >= comp->maxState) {
        int *tmp;
        int newSize;

        newSize = xmlGrowCapacity(comp->maxState, sizeof(tmp[0]) * 2,
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: growCapacity failed\n");
	    return(-1);
        }
	tmp = xmlRealloc(comp->states, newSize * sizeof(tmp[0]) * 2);
	if (tmp == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: malloc failed\n");
	    return(-1);
	}
	comp->states = tmp;
        comp->maxState = newSize;
    }
    comp->states[2 * comp->nbState] = idx;
    comp->states[2 * comp->nbState++ + 1] = level;
    return(comp->nbState - 1);
}